

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void sel_object_proc(Am_Object *inter,int mouse_x,int mouse_y,Am_Object *ref_obj,Am_Input_Char ic)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *this;
  Am_Object widget;
  Am_Object new_object;
  Am_Value obj_value;
  Am_Value old_value;
  Am_Value new_value;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object diff_obj;
  Am_Object local_70;
  Am_String local_68;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  new_object.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Object::Valid(inter);
  if (!bVar1) goto LAB_0024f8fb;
  Am_Object::Get_Object(&widget,(Am_Slot_Key)inter,10);
  clear_multi_selections(&widget);
  pAVar3 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&new_object,pAVar3);
  bVar1 = Am_Object::Valid(&new_object);
  if (bVar1) {
    new_value.type = 0;
    new_value.value.wrapper_value = (Am_Wrapper *)0x0;
    bVar1 = Am_Object::operator==(&new_object,&widget);
    if (bVar1) {
      if (((uint)ic >> 0x10 & 1) != 0) {
        Am_Object::Am_Object(&local_70,inter);
        Am_Abort_Interactor(&local_70,true);
        Am_Object::~Am_Object(&local_70);
LAB_0024f728:
        Am_Value::~Am_Value(&new_value);
        goto LAB_0024f8f1;
      }
      Am_Object::operator=(&new_object,(Am_Object_Data *)0x0);
      Am_Value_List::Am_Value_List((Am_Value_List *)&old_value);
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_value);
      Am_Value::operator=(&new_value,pAVar4);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&old_value);
    }
    else {
      old_value.type = 0;
      old_value.value.wrapper_value = (Am_Wrapper *)0x0;
      pAVar3 = Am_Object::Get(&widget,0x1a3,1);
      Am_Value::operator=(&old_value,pAVar3);
      bVar2 = Am_Value::Valid(&old_value);
      bVar1 = true;
      if (bVar2) {
        pAVar3 = Am_Object::Get(&widget,0x1a6,0);
        Am_Where_Method::Am_Where_Method((Am_Where_Method *)&obj_value,pAVar3);
        Am_Object::Am_Object(&local_80,&widget);
        Am_Object::Am_Object(&local_88,&new_object);
        Am_Object::Am_Object(&local_90,ref_obj);
        (*obj_value.value.proc_value)
                  (&diff_obj,&local_80,&local_88,&local_90,(ulong)(uint)mouse_x,(ulong)(uint)mouse_y
                  );
        Am_Object::~Am_Object(&local_90);
        Am_Object::~Am_Object(&local_88);
        Am_Object::~Am_Object(&local_80);
        bVar1 = Am_Object::Valid(&diff_obj);
        bVar1 = !bVar1;
        Am_Object::~Am_Object(&diff_obj);
      }
      Am_Value_List::Am_Value_List((Am_Value_List *)&obj_value);
      pAVar3 = Am_Object::Get(&widget,0x169,0);
      Am_Value_List::operator=((Am_Value_List *)&obj_value,pAVar3);
      Am_Value_List::Start((Am_Value_List *)&obj_value);
      if (((uint)ic >> 0x10 & 1) == 0) {
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
        bVar2 = Am_Value_List::Member((Am_Value_List *)&obj_value,pAVar4);
        if (bVar2) {
          if (bVar1) {
            Am_Object::Am_Object(&local_a0,inter);
            Am_Abort_Interactor(&local_a0,true);
            Am_Object::~Am_Object(&local_a0);
            Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_value);
            Am_Value::~Am_Value(&old_value);
            goto LAB_0024f728;
          }
        }
        else {
          Am_Value_List::Make_Empty((Am_Value_List *)&obj_value);
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
          Am_Value_List::Add((Am_Value_List *)&obj_value,pAVar4,Am_TAIL,true);
        }
      }
      else {
        this = &local_98;
        Am_Object::Am_Object(this,&new_object);
        toggle_object_in_list(this,&local_98,(Am_Value_List *)&obj_value);
        Am_Object::~Am_Object(&local_98);
      }
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&obj_value);
      Am_Value::operator=(&new_value,pAVar4);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&obj_value);
      Am_Value::~Am_Value(&old_value);
    }
    old_value.type = 0;
    old_value.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar3 = Am_Object::Get(&widget,0x169,1);
    Am_Value::operator=(&old_value,pAVar3);
    Am_Object::Set(&widget,0x169,&new_value,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
    Am_Value::Am_Value(&obj_value,pAVar4);
    Am_Value::Am_Value(&local_40,&obj_value);
    Am_Value::Am_Value(&local_50,&new_value);
    Am_Value::Am_Value(&local_60,&old_value);
    Am_String::Am_String(&local_68,"Select",true);
    set_commands_for_sel
              (&Am_No_Object,inter,&widget,&local_40,&local_50,&local_60,true,
               (Am_String_Data *)&local_68,Am_Sel_NONE,false);
    Am_String::~Am_String(&local_68);
    Am_Value::~Am_Value(&local_60);
    Am_Value::~Am_Value(&local_50);
    Am_Value::~Am_Value(&local_40);
    Am_Value::~Am_Value(&obj_value);
    Am_Value::~Am_Value(&old_value);
    Am_Value::~Am_Value(&new_value);
  }
LAB_0024f8f1:
  Am_Object::~Am_Object(&widget);
LAB_0024f8fb:
  Am_Object::~Am_Object(&new_object);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, sel_object,
                 (Am_Object inter, int mouse_x, int mouse_y, Am_Object ref_obj,
                  Am_Input_Char ic))
{
  Am_Object new_object;
  if (inter.Valid()) {
    Am_Object widget = inter.Get_Owner();
    clear_multi_selections(widget);
    new_object = inter.Get(Am_START_OBJECT);
    if (new_object.Valid()) {
      Am_Value new_value;
      bool toggle_in_set = ic.shift;
      if (new_object == widget) {     // then clicked in the background
        if (toggle_in_set) {          //  don't do anything
          Am_Abort_Interactor(inter); //make sure not queued for undo
          return;
        } else { // select nothing
          Am_INTER_TRACE_PRINT(widget, "Selection handle setting empty for "
                                           << widget);
          new_object = nullptr; //so object_modified will be null
          new_value = Am_Value_List();
        }
      } else { // over a specific object
        Am_Value value;
        value = widget.Peek(Am_SELECT_CLOSEST_POINT_STYLE);
        bool abort_ok = true;
        if (value.Valid()) {
          Am_Where_Method method = widget.Get(Am_SELECT_CLOSEST_POINT_METHOD);
          Am_Object diff_obj =
              method.Call(widget, new_object, ref_obj, mouse_x, mouse_y);
          if (diff_obj.Valid())
            abort_ok = false;
        }
        Am_Value_List list;
        list = widget.Get(Am_VALUE);
        list.Start();
        if (toggle_in_set)
          toggle_object_in_list(widget, new_object, list);
        else { //if object is selected, do nothing, otherwise,
          // make new_object be the only selection
          if (list.Member(new_object)) { //nothing to do if already selected
            if (abort_ok) {
              Am_Abort_Interactor(inter); //make sure not queued for undo
              return;
            }
          } else {
            Am_INTER_TRACE_PRINT(widget, "Selection handle setting "
                                             << widget << " to contain only "
                                             << new_object);
            list.Make_Empty();
            list.Add(new_object);
          }
        }
        new_value = list;
      }
      Am_Value old_value;
      old_value = widget.Peek(Am_VALUE);
      widget.Set(Am_VALUE, new_value);
      Am_Value obj_value = Am_Value(new_object);
      set_commands_for_sel(Am_No_Object, inter, widget, obj_value, new_value,
                           old_value, true, "Select");
    }
  }
}